

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

void __thiscall ot::commissioner::security_material::SMRoot::Set(SMRoot *this,string *aRoot)

{
  long lVar1;
  char *pcVar2;
  string *aRoot_local;
  SMRoot *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)aRoot);
  lVar1 = std::__cxx11::string::length();
  if (lVar1 != 0) {
    pcVar2 = (char *)std::__cxx11::string::back();
    if (*pcVar2 != '/') {
      std::__cxx11::string::operator+=((string *)this,"/");
    }
  }
  return;
}

Assistant:

void Set(const std::string aRoot)
    {
        mRootPath = aRoot;
        if (mRootPath.length() > 0 && mRootPath.back() != '/')
        {
            mRootPath += "/";
        }
    }